

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void QMessageBox::about(QWidget *parent,QString *title,QString *text)

{
  QFlagsStorage<Qt::WindowType> h;
  QString *text_00;
  undefined8 in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  double dVar1;
  QMessageBox *msgBox;
  QIcon icon;
  StandardButton in_stack_ffffffffffffff4c;
  enum_type in_stack_ffffffffffffff50;
  enum_type in_stack_ffffffffffffff54;
  State SVar2;
  QString *in_stack_ffffffffffffff78;
  QMessageBox *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 local_38 [8];
  QPixmap local_30 [24];
  QIcon local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  text_00 = (QString *)operator_new(0x28);
  QFlags<QMessageBox::StandardButton>::QFlags
            ((QFlags<QMessageBox::StandardButton> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c
            );
  h.i = (Int)Qt::operator|(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
  QMessageBox(in_stack_ffffffffffffff88,Information,in_stack_ffffffffffffff78,text_00,
              (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)
              SUB84((ulong)in_stack_ffffffffffffffa8 >> 0x20,0),in_RDI,
              (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84(in_stack_ffffffffffffffa8,0));
  QWidget::setAttribute
            (in_RSI,(WidgetAttribute)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  local_18[0].d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowIcon(in_RDI);
  SVar2 = (State)local_38;
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c,h.i);
  dVar1 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap((QSize *)local_30,dVar1,(Mode)local_18,SVar2);
  setIconPixmap((QMessageBox *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                (QPixmap *)CONCAT44(in_stack_ffffffffffffff4c,h.i));
  QPixmap::~QPixmap(local_30);
  (*(code *)(text_00->d).d[0x1a].super_QArrayData.alloc)();
  QIcon::~QIcon(local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::about(QWidget *parent, const QString &title, const QString &text)
{
#ifdef Q_OS_MAC
    static QPointer<QMessageBox> oldMsgBox;

    if (oldMsgBox && oldMsgBox->text() == text) {
        oldMsgBox->show();
        oldMsgBox->raise();
        oldMsgBox->activateWindow();
        return;
    }
#endif

    QMessageBox *msgBox = new QMessageBox(Information, title, text, NoButton, parent
#ifdef Q_OS_MAC
                                          , Qt::WindowTitleHint | Qt::WindowSystemMenuHint
#endif
    );
    msgBox->setAttribute(Qt::WA_DeleteOnClose);
    QIcon icon = msgBox->windowIcon();
    msgBox->setIconPixmap(icon.pixmap(QSize(64, 64), msgBox->devicePixelRatio()));

    // should perhaps be a style hint
#ifdef Q_OS_MAC
    oldMsgBox = msgBox;
    auto *d = msgBox->d_func();
    d->buttonBox->setCenterButtons(true);
#ifdef Q_OS_IOS
    msgBox->setModal(true);
#else
    msgBox->setModal(false);
#endif
    msgBox->show();
#else
    msgBox->exec();
#endif
}